

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::
ParticlePairs(ParticlePairs *this,int njsx,vector<double,_std::allocator<double>_> *ma,
             vector<double,_std::allocator<double>_> *mb,vector<double,_std::allocator<double>_> *za
             ,vector<double,_std::allocator<double>_> *zb,
             vector<double,_std::allocator<double>_> *ia,vector<double,_std::allocator<double>_> *ib
             ,vector<double,_std::allocator<double>_> *pa,
             vector<double,_std::allocator<double>_> *pb,vector<double,_std::allocator<double>_> *q,
             vector<int,_std::allocator<int>_> *pnt,vector<int,_std::allocator<int>_> *shf,
             vector<int,_std::allocator<int>_> *mt)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  _Vector_base<double,_std::allocator<double>_> local_88;
  ListRecord local_68;
  
  pdVar1 = (ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar2 = (ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  generateList((vector<double,_std::allocator<double>_> *)&local_88,ma,mb,za,zb,ia,ib,q,pnt,shf,mt,
               pa,pb);
  lVar3 = (long)pdVar2 - (long)pdVar1;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       lVar3 >> 3;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(lVar3 >> 2);
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)njsx;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_88._M_impl.super__Vector_impl_data._M_finish -
       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._M_impl.super__Vector_impl_data._M_start;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParticlePairs(this,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_68.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

ParticlePairs( int njsx,
               std::vector< double >&& ma, std::vector< double >&& mb,
               std::vector< double >&& za, std::vector< double >&& zb,
               std::vector< double >&& ia, std::vector< double >&& ib,
               std::vector< double >&& pa, std::vector< double >&& pb,
               std::vector< double >&& q, std::vector< int >&& pnt,
               std::vector< int >&& shf, std::vector< int >&& mt )
  try : ParticlePairs(
          ListRecord( 0., 0., ma.size(), njsx, 2 * ma.size(),
                      generateList( std::move( ma ), std::move( mb ),
                                    std::move( za ), std::move( zb ),
                                    std::move( ia ), std::move( ib ),
                                    std::move( q ), std::move( pnt ),
                                    std::move( shf ), std::move( mt ),
                                    std::move( pa ), std::move( pb ) ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing particle pairs" );
    throw;
  }